

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O3

int mbedtls_hmac_drbg_update(mbedtls_hmac_drbg_context *ctx,uchar *additional,size_t add_len)

{
  uchar *input;
  byte bVar1;
  int iVar2;
  bool bVar3;
  ulong ilen;
  uchar local_78 [8];
  uchar K [32];
  byte local_38;
  byte local_31;
  
  bVar1 = mbedtls_md_get_size((ctx->md_ctx).md_info);
  ilen = (ulong)bVar1;
  bVar3 = add_len != 0 && additional != (uchar *)0x0;
  input = ctx->V;
  local_31 = 0;
  local_38 = bVar3 + 1;
  do {
    iVar2 = mbedtls_md_hmac_reset(&ctx->md_ctx);
    if ((((iVar2 != 0) || (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 != 0)) ||
        (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,&local_31,1), iVar2 != 0)) ||
       ((bVar3 && (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,additional,add_len), iVar2 != 0))))
    goto LAB_002257f4;
    iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,local_78);
    if (((iVar2 != 0) ||
        ((iVar2 = mbedtls_md_hmac_starts(&ctx->md_ctx,local_78,ilen), iVar2 != 0 ||
         (iVar2 = mbedtls_md_hmac_update(&ctx->md_ctx,input,ilen), iVar2 != 0)))) ||
       (iVar2 = mbedtls_md_hmac_finish(&ctx->md_ctx,input), iVar2 != 0)) goto LAB_002257f4;
    local_31 = local_31 + 1;
  } while (local_31 < local_38);
  iVar2 = 0;
LAB_002257f4:
  mbedtls_platform_zeroize(local_78,0x20);
  return iVar2;
}

Assistant:

int mbedtls_hmac_drbg_update(mbedtls_hmac_drbg_context *ctx,
                             const unsigned char *additional,
                             size_t add_len)
{
    size_t md_len = mbedtls_md_get_size(ctx->md_ctx.md_info);
    unsigned char rounds = (additional != NULL && add_len != 0) ? 2 : 1;
    unsigned char sep[1];
    unsigned char K[MBEDTLS_MD_MAX_SIZE];
    int ret = MBEDTLS_ERR_MD_BAD_INPUT_DATA;

    for (sep[0] = 0; sep[0] < rounds; sep[0]++) {
        /* Step 1 or 4 */
        if ((ret = mbedtls_md_hmac_reset(&ctx->md_ctx)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          ctx->V, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          sep, 1)) != 0) {
            goto exit;
        }
        if (rounds == 2) {
            if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                              additional, add_len)) != 0) {
                goto exit;
            }
        }
        if ((ret = mbedtls_md_hmac_finish(&ctx->md_ctx, K)) != 0) {
            goto exit;
        }

        /* Step 2 or 5 */
        if ((ret = mbedtls_md_hmac_starts(&ctx->md_ctx, K, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_update(&ctx->md_ctx,
                                          ctx->V, md_len)) != 0) {
            goto exit;
        }
        if ((ret = mbedtls_md_hmac_finish(&ctx->md_ctx, ctx->V)) != 0) {
            goto exit;
        }
    }

exit:
    mbedtls_platform_zeroize(K, sizeof(K));
    return ret;
}